

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void deqp::gls::FboUtil::logField(TestLog *log,string *field,string *value)

{
  ostringstream *this;
  undefined1 local_198 [384];
  
  this = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,(string *)field);
  std::operator<<((ostream *)this,": ");
  std::operator<<((ostream *)this,(string *)value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  return;
}

Assistant:

static void logField (TestLog& log, const string& field, const string& value)
{
	log << TestLog::Message << field << ": " << value << TestLog::EndMessage;
}